

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshaderdescription.cpp
# Opt level: O0

QJsonObject * builtinObject(BuiltinVariable *v)

{
  bool bVar1;
  int *piVar2;
  QJsonObject *in_RDI;
  long in_FS_OFFSET;
  QLatin1StringView QVar3;
  int dim;
  QList<int> *__range2;
  QJsonObject *obj;
  const_iterator __end2;
  const_iterator __begin2;
  QJsonArray dimArr;
  QJsonObject *pQVar4;
  QLatin1String *local_100;
  QLatin1String *local_e0;
  undefined1 local_b8 [16];
  int *local_a8;
  const_iterator local_a0;
  const_iterator local_98;
  undefined1 *local_90;
  QJsonValueRef local_88 [16];
  QJsonValueRef local_78 [16];
  QJsonValue local_68 [24];
  QJsonValue local_50 [24];
  QJsonValue local_38 [24];
  QJsonValue local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
  pQVar4 = in_RDI;
  QJsonObject::QJsonObject(in_RDI);
  QVar3 = builtinTypeStr((BuiltinType)((ulong)pQVar4 >> 0x20));
  local_e0 = (QLatin1String *)QVar3.m_size;
  QJsonValue::QJsonValue(local_20,local_e0);
  nameKey();
  local_78 = (QJsonValueRef  [16])QJsonObject::operator[]((QLatin1String *)pQVar4);
  QJsonValueRef::operator=(local_78,local_20);
  QJsonValue::~QJsonValue(local_20);
  QVar3 = typeStr((VariableType)((ulong)pQVar4 >> 0x20));
  local_100 = (QLatin1String *)QVar3.m_size;
  QJsonValue::QJsonValue(local_38,local_100);
  typeKey();
  local_88 = (QJsonValueRef  [16])QJsonObject::operator[]((QLatin1String *)pQVar4);
  QJsonValueRef::operator=(local_88,local_38);
  QJsonValue::~QJsonValue(local_38);
  bVar1 = QList<int>::isEmpty((QList<int> *)0x6e1555);
  if (!bVar1) {
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    QJsonArray::QJsonArray((QJsonArray *)&local_90);
    local_98.i = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_98 = QList<int>::begin((QList<int> *)in_RDI);
    local_a0.i = (int *)&DAT_aaaaaaaaaaaaaaaa;
    local_a0 = QList<int>::end((QList<int> *)in_RDI);
    while( true ) {
      local_a8 = local_a0.i;
      bVar1 = QList<int>::const_iterator::operator!=(&local_98,local_a0);
      if (!bVar1) break;
      piVar2 = QList<int>::const_iterator::operator*(&local_98);
      QJsonValue::QJsonValue(local_50,*piVar2);
      QJsonArray::append((QJsonValue *)&local_90);
      QJsonValue::~QJsonValue(local_50);
      QList<int>::const_iterator::operator++(&local_98);
    }
    QJsonValue::QJsonValue(local_68,(QJsonArray *)&local_90);
    arrayDimsKey();
    local_b8 = QJsonObject::operator[]((QLatin1String *)pQVar4);
    QJsonValueRef::operator=((QJsonValueRef *)local_b8,local_68);
    QJsonValue::~QJsonValue(local_68);
    QJsonArray::~QJsonArray((QJsonArray *)&local_90);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

static QJsonObject builtinObject(const QShaderDescription::BuiltinVariable &v)
{
    QJsonObject obj;

    obj[nameKey()] = builtinTypeStr(v.type);
    obj[typeKey()] = typeStr(v.varType);
    if (!v.arrayDims.isEmpty()) {
        QJsonArray dimArr;
        for (int dim : v.arrayDims)
            dimArr.append(dim);
        obj[arrayDimsKey()] = dimArr;
    }
    return obj;
}